

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char_conversions.h
# Opt level: O2

conversion_result mjs::unicode::utf8_to_utf32<char>(char *src,uint max_length)

{
  byte first_code_point;
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  
  if (max_length == 0) {
    __assert_fail("max_length != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/char_conversions.h"
                  ,0x24,
                  "conversion_result mjs::unicode::utf8_to_utf32(const CharT *, unsigned int) [CharT = char]"
                 );
  }
  first_code_point = *src;
  uVar5 = (ulong)first_code_point;
  uVar1 = utf8_length_from_lead_code_unit(first_code_point);
  if (uVar1 - 1 < max_length) {
    if (uVar1 == 1) {
      uVar2 = 1;
    }
    else {
      uVar4 = 0xfcU >> ((byte)uVar1 & 0x1f) & (uint)first_code_point;
      uVar2 = (ulong)uVar1;
      for (uVar3 = 1; uVar5 = (ulong)uVar4, uVar3 < uVar2; uVar3 = uVar3 + 1) {
        if (((byte)src[uVar3] & 0xffffffc0) != 0x80) goto LAB_0017a695;
        uVar4 = uVar4 << 6 | (byte)src[uVar3] & 0x3f;
      }
    }
  }
  else {
LAB_0017a695:
    uVar2 = 0;
    uVar5 = 0;
  }
  return (conversion_result)(uVar5 << 0x20 | uVar2);
}

Assistant:

constexpr conversion_result utf8_to_utf32(const CharT* src, unsigned max_length) {
    static_assert(sizeof(CharT) == 1);
    assert(max_length != 0);
    const auto first_code_unit = static_cast<uint8_t>(src[0]);
    const auto l = utf8_length_from_lead_code_unit(first_code_unit);
    if (!l) {
        // Invalid leading byte
        return invalid_conversion;
    } else if (l > max_length) {
        // Not enough source characters
        return invalid_conversion;
    } else if (l == 1) {
        // Simple case
        return { 1, first_code_unit };
    }
    char32_t code_point = first_code_unit & (0b1111'1100 >> l);
    for (unsigned i = 1; i < l; ++i) {
        const auto here = static_cast<uint8_t>(src[i]);
        if ((here & 0b1100'0000) != 0b1000'0000) {
            // Invalid continuation byte
            return invalid_conversion;
        }
        code_point <<= 6;
        code_point |= here & 0x3f;
    }
    
    return { l, code_point };
}